

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3TermSelect(Fts3Table *p,Fts3PhraseToken *pTok,int iColumn,int *pnOut,char **ppOut)

{
  Fts3MultiSegReader *pCsr;
  char *a2;
  int iVar1;
  void *__dest;
  int n1;
  int i;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 local_120 [24];
  char *aNew;
  int nNew;
  void *local_f8 [15];
  char *pcStack_80;
  int local_78 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_120._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pCsr = pTok->pSegcsr;
  memset(local_f8,0,0xc0);
  local_120._16_4_ =
       (uint)(pTok->bFirst != 0) * 0x20 + (uint)(pTok->isPrefix != 0) * 8 + 3 +
       (uint)(iColumn < p->nColumn) * 4;
  local_120._0_8_ = pTok->z;
  local_120._8_4_ = pTok->n;
  local_120._12_4_ = iColumn;
  iVar1 = sqlite3Fts3SegReaderStart(p,pCsr,(Fts3SegFilter *)local_120);
LAB_001b2451:
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts3SegReaderStep(p,pCsr);
    if (iVar1 != 100) {
      if (iVar1 == 0) {
        lVar4 = 0;
        pcVar2 = (char *)0x0;
        iVar1 = 0;
        goto LAB_001b25b1;
      }
      goto LAB_001b26ab;
    }
    pcVar2 = pCsr->aDoclist;
    n1 = pCsr->nDoclist;
    if (local_f8[0] == (void *)0x0) {
      __n = (size_t)n1;
      __dest = sqlite3_malloc64(__n + 0xb);
      local_f8[0] = __dest;
      local_78[0] = n1;
      iVar1 = 7;
      if (__dest != (void *)0x0) {
        memcpy(__dest,pcVar2,__n);
        *(undefined8 *)((long)__dest + __n) = 0;
        *(undefined2 *)((long)__dest + __n + 8) = 0;
        iVar1 = 0;
      }
    }
    else {
      lVar4 = 0;
      pcVar3 = pcVar2;
      while( true ) {
        iVar1 = 0;
        if (lVar4 == 0x40) break;
        a2 = *(char **)((long)local_f8 + lVar4 * 2);
        if (a2 == (char *)0x0) {
          *(char **)((long)local_f8 + lVar4 * 2) = pcVar3;
          *(int *)((long)local_78 + lVar4) = n1;
          iVar1 = 0;
          break;
        }
        aNew = &DAT_aaaaaaaaaaaaaaaa;
        nNew = -0x55555556;
        iVar1 = fts3DoclistOrMerge((uint)p->bDescIdx,pcVar3,n1,a2,*(int *)((long)local_78 + lVar4),
                                   &aNew,&nNew);
        if (iVar1 != 0) {
          if (pcVar3 != pcVar2) {
            sqlite3_free(pcVar3);
          }
          break;
        }
        if (pcVar3 != pcVar2) {
          sqlite3_free(pcVar3);
        }
        sqlite3_free(a2);
        *(undefined8 *)((long)local_f8 + lVar4 * 2) = 0;
        if (lVar4 == 0x3c) {
          pcStack_80 = aNew;
          local_78[0xf] = nNew;
        }
        lVar4 = lVar4 + 4;
        pcVar3 = aNew;
        n1 = nNew;
      }
    }
    goto LAB_001b2451;
  }
LAB_001b26ab:
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    sqlite3_free(local_f8[lVar4]);
  }
LAB_001b2665:
  fts3SegReaderCursorFree(pCsr);
  pTok->pSegcsr = (Fts3MultiSegReader *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
LAB_001b25b1:
  if (lVar4 == 0x10) goto LAB_001b2651;
  pcVar3 = (char *)local_f8[lVar4];
  if (pcVar3 != (char *)0x0) {
    if (pcVar2 == (char *)0x0) {
      iVar1 = local_78[lVar4];
      local_f8[lVar4] = (void *)0x0;
      pcVar2 = pcVar3;
    }
    else {
      nNew = -0x55555556;
      aNew = &DAT_aaaaaaaaaaaaaaaa;
      iVar1 = fts3DoclistOrMerge((uint)p->bDescIdx,pcVar3,local_78[lVar4],pcVar2,iVar1,&aNew,&nNew);
      if (iVar1 != 0) {
        sqlite3_free(pcVar2);
        goto LAB_001b26ab;
      }
      sqlite3_free(local_f8[lVar4]);
      sqlite3_free(pcVar2);
      local_f8[lVar4] = (void *)0x0;
      pcVar2 = aNew;
      iVar1 = nNew;
    }
  }
  lVar4 = lVar4 + 1;
  goto LAB_001b25b1;
LAB_001b2651:
  *ppOut = pcVar2;
  *pnOut = iVar1;
  iVar1 = 0;
  goto LAB_001b2665;
}

Assistant:

static int fts3TermSelect(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3PhraseToken *pTok,          /* Token to query for */
  int iColumn,                    /* Column to query (or -ve for all columns) */
  int *pnOut,                     /* OUT: Size of buffer at *ppOut */
  char **ppOut                    /* OUT: Malloced result buffer */
){
  int rc;                         /* Return code */
  Fts3MultiSegReader *pSegcsr;    /* Seg-reader cursor for this term */
  TermSelect tsc;                 /* Object for pair-wise doclist merging */
  Fts3SegFilter filter;           /* Segment term filter configuration */

  pSegcsr = pTok->pSegcsr;
  memset(&tsc, 0, sizeof(TermSelect));

  filter.flags = FTS3_SEGMENT_IGNORE_EMPTY | FTS3_SEGMENT_REQUIRE_POS
        | (pTok->isPrefix ? FTS3_SEGMENT_PREFIX : 0)
        | (pTok->bFirst ? FTS3_SEGMENT_FIRST : 0)
        | (iColumn<p->nColumn ? FTS3_SEGMENT_COLUMN_FILTER : 0);
  filter.iCol = iColumn;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;

  rc = sqlite3Fts3SegReaderStart(p, pSegcsr, &filter);
  while( SQLITE_OK==rc
      && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pSegcsr))
  ){
    rc = fts3TermSelectMerge(p, &tsc, pSegcsr->aDoclist, pSegcsr->nDoclist);
  }

  if( rc==SQLITE_OK ){
    rc = fts3TermSelectFinishMerge(p, &tsc);
  }
  if( rc==SQLITE_OK ){
    *ppOut = tsc.aaOutput[0];
    *pnOut = tsc.anOutput[0];
  }else{
    int i;
    for(i=0; i<SizeofArray(tsc.aaOutput); i++){
      sqlite3_free(tsc.aaOutput[i]);
    }
  }

  fts3SegReaderCursorFree(pSegcsr);
  pTok->pSegcsr = 0;
  return rc;
}